

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O1

void decimate(double *x,int x_length,int r,double *y)

{
  long lVar1;
  uint x_length_00;
  int iVar2;
  double dVar3;
  int iVar4;
  double *x_00;
  double *y_00;
  long lVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  
  x_length_00 = x_length + 0x12;
  uVar6 = 0xffffffffffffffff;
  if (-0x13 < x_length) {
    uVar6 = (long)(int)x_length_00 * 8;
  }
  x_00 = (double *)operator_new__(uVar6);
  y_00 = (double *)operator_new__(uVar6);
  dVar3 = *x;
  lVar5 = 0x48;
  pdVar7 = x_00;
  do {
    *pdVar7 = (dVar3 + dVar3) - *(double *)((long)x + lVar5);
    pdVar7 = pdVar7 + 1;
    lVar5 = lVar5 + -8;
  } while (lVar5 != 0);
  iVar2 = x_length + 9;
  if (0 < x_length) {
    iVar4 = 10;
    if (10 < iVar2) {
      iVar4 = iVar2;
    }
    memcpy(x_00 + 9,x,(ulong)(iVar4 - 9) << 3);
  }
  dVar3 = x[(long)x_length + -1];
  iVar4 = x_length + -2;
  lVar5 = (long)iVar2;
  do {
    x_00[lVar5] = (dVar3 + dVar3) - x[iVar4];
    lVar5 = lVar5 + 1;
    iVar4 = iVar4 + -1;
  } while (lVar5 < (int)x_length_00);
  anon_unknown.dwarf_767f::FilterForDecimate(x_00,x_length_00,r,y_00);
  if (-0x12 < x_length) {
    uVar6 = 1;
    if (1 < (int)x_length_00) {
      uVar6 = (ulong)x_length_00;
    }
    iVar4 = x_length + 0x11;
    uVar8 = 0;
    do {
      x_00[uVar8] = y_00[iVar4];
      uVar8 = uVar8 + 1;
      iVar4 = iVar4 + -1;
    } while (uVar6 != uVar8);
  }
  anon_unknown.dwarf_767f::FilterForDecimate(x_00,x_length_00,r,y_00);
  if (-0x12 < x_length) {
    uVar6 = 1;
    if (1 < (int)x_length_00) {
      uVar6 = (ulong)x_length_00;
    }
    iVar4 = x_length + 0x11;
    uVar8 = 0;
    do {
      x_00[uVar8] = y_00[iVar4];
      uVar8 = uVar8 + 1;
      iVar4 = iVar4 + -1;
    } while (uVar6 != uVar8);
  }
  iVar4 = (x_length + -1) % r;
  if (iVar4 + 1 < iVar2) {
    lVar5 = (long)iVar4 + 9;
    do {
      *y = x_00[lVar5];
      y = y + 1;
      lVar1 = lVar5 + r;
      lVar5 = lVar5 + r;
    } while (lVar1 + -8 < (long)iVar2);
  }
  operator_delete__(x_00);
  operator_delete__(y_00);
  return;
}

Assistant:

void decimate(const double *x, int x_length, int r, double *y) {
  const int kNFact = 9;
  double *tmp1 = new double[x_length + kNFact * 2];
  double *tmp2 = new double[x_length + kNFact * 2];

  for (int i = 0; i < kNFact; ++i) tmp1[i] = 2 * x[0] - x[kNFact - i];
  for (int i = kNFact; i < kNFact + x_length; ++i) tmp1[i] = x[i - kNFact];
  for (int i = kNFact + x_length; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = 2 * x[x_length - 1] - x[x_length - 2 - (i - (kNFact + x_length))];

  FilterForDecimate(tmp1, 2 * kNFact + x_length, r, tmp2);
  for (int i = 0; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = tmp2[2 * kNFact + x_length - i - 1];
  FilterForDecimate(tmp1, 2 * kNFact + x_length, r, tmp2);
  for (int i = 0; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = tmp2[2 * kNFact + x_length - i - 1];

  int nout = (x_length - 1) / r + 1;
  int nbeg = r - r * nout + x_length;

  int count = 0;
  for (int i = nbeg; i < x_length + kNFact; i += r)
    y[count++] = tmp1[i + kNFact - 1];

  delete[] tmp1;
  delete[] tmp2;
}